

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::eliminatePivot(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,int prow,int pos,
                number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *eps)

{
  long lVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000050;
  int in_stack_00000058;
  int in_stack_0000005c;
  int in_stack_00000060;
  int in_stack_00000064;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000068;
  int pend;
  int plen;
  int pbeg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pval;
  int pcol;
  int lv;
  int m;
  int k;
  int j;
  int i;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffce8;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  undefined4 local_2c0;
  cpp_dec_float<100U,_int,_void> local_2bc [2];
  cpp_dec_float<100U,_int,_void> local_21c [2];
  undefined1 local_17c [80];
  int local_12c;
  int local_128;
  int local_124;
  undefined1 local_120 [80];
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b0;
  int local_ac;
  undefined1 *local_a0;
  undefined4 *local_98;
  long local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int p_row;
  undefined8 in_stack_ffffffffffffff98;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffa0;
  
  p_row = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_c8 = -1;
  local_cc = -1;
  local_a0 = local_120;
  local_b0 = in_EDX;
  local_ac = in_ESI;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffcf0);
  local_124 = *(int *)(*(long *)(in_RDI + 0x2a8) + (long)local_ac * 4);
  local_128 = *(int *)(*(long *)(in_RDI + 0x2b0) + (long)local_ac * 4) + -1;
  *(int *)(*(long *)(in_RDI + 0x2b0) + (long)local_ac * 4) = local_128;
  local_12c = local_124 + local_128;
  local_bc = local_124 + local_b0;
  local_d0 = *(int *)(*(long *)(in_RDI + 0x2a0) + (long)local_bc * 4);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)(in_RDI + 0x288),(long)local_bc);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x398) + (long)local_d0 * 0x20) + 8) =
       *(undefined8 *)(*(long *)(in_RDI + 0x398) + (long)local_d0 * 0x20 + 8);
  **(undefined8 **)(*(long *)(in_RDI + 0x398) + (long)local_d0 * 0x20 + 8) =
       *(undefined8 *)(*(long *)(in_RDI + 0x398) + (long)local_d0 * 0x20);
  lVar1 = *(long *)(in_RDI + 0x398) + (long)local_d0 * 0x20;
  *(long *)(*(long *)(in_RDI + 0x398) + (long)local_d0 * 0x20) = lVar1;
  *(long *)(*(long *)(in_RDI + 0x398) + (long)local_d0 * 0x20 + 8) = lVar1;
  *(undefined4 *)(*(long *)(in_RDI + 0x2a0) + (long)local_bc * 4) =
       *(undefined4 *)(*(long *)(in_RDI + 0x2a0) + (long)local_12c * 4);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)(in_RDI + 0x288),(long)local_12c);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)(in_RDI + 0x288),(long)local_bc);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  *(int *)(in_RDI + 0x370) = *(int *)(in_RDI + 0x370) + 1;
  local_80 = local_17c;
  local_88 = local_120;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  setPivot(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
           (int)in_stack_ffffffffffffff98,p_row,in_stack_ffffffffffffff88);
  if (0 < *(int *)(*(long *)(in_RDI + 0x368) + (long)local_d0 * 4) + -1) {
    local_cc = makeLvec((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                        in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08);
  }
  for (local_bc = local_124; local_bc < local_12c; local_bc = local_bc + 1) {
    local_c0 = *(int *)(*(long *)(in_RDI + 0x2a0) + (long)local_bc * 4);
    *(undefined4 *)(*(long *)(in_RDI + 0x348) + (long)local_c0 * 4) = 1;
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *)(in_RDI + 0x288),(long)local_bc);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x398) + (long)local_c0 * 0x20) + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x398) + (long)local_c0 * 0x20 + 8);
    **(undefined8 **)(*(long *)(in_RDI + 0x398) + (long)local_c0 * 0x20 + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x398) + (long)local_c0 * 0x20);
    local_c8 = (*(int *)(*(long *)(in_RDI + 0x308) + (long)local_c0 * 4) +
               *(int *)(*(long *)(in_RDI + 0x310) + (long)local_c0 * 4)) -
               *(int *)(*(long *)(in_RDI + 0x368) + (long)local_c0 * 4);
    local_c4 = local_c8;
    while (*(int *)(*(long *)(in_RDI + 0x2e8) + (long)local_c4 * 4) != local_ac) {
      local_c4 = local_c4 + 1;
    }
    *(undefined4 *)(*(long *)(in_RDI + 0x2e8) + (long)local_c4 * 4) =
         *(undefined4 *)(*(long *)(in_RDI + 0x2e8) + (long)local_c8 * 4);
    *(int *)(*(long *)(in_RDI + 0x2e8) + (long)local_c8 * 4) = local_ac;
    *(int *)(*(long *)(in_RDI + 0x368) + (long)local_c0 * 4) =
         *(int *)(*(long *)(in_RDI + 0x368) + (long)local_c0 * 4) + -1;
  }
  local_bc = *(int *)(*(long *)(in_RDI + 0x310) + (long)local_d0 * 4) -
             *(int *)(*(long *)(in_RDI + 0x368) + (long)local_d0 * 4);
  while (local_c8 = *(int *)(*(long *)(in_RDI + 0x2e8) +
                            (long)(*(int *)(*(long *)(in_RDI + 0x308) + (long)local_d0 * 4) +
                                  local_bc) * 4), local_c8 != local_ac) {
    local_cc = local_cc + 1;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    in_stack_fffffffffffffce8 = local_21c;
    updateRow(in_stack_00000068,in_stack_00000064,in_stack_00000060,in_stack_0000005c,
              in_stack_00000058,in_stack_00000050,
              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)pval.m_backend._72_8_);
    local_bc = local_bc + 1;
  }
  local_c8 = *(int *)(*(long *)(in_RDI + 0x310) + (long)local_d0 * 4);
  while (local_bc = local_bc + 1, local_bc < local_c8) {
    local_cc = local_cc + 1;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    in_stack_fffffffffffffce8 = local_2bc;
    updateRow(in_stack_00000068,in_stack_00000064,in_stack_00000060,in_stack_0000005c,
              in_stack_00000058,in_stack_00000050,
              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)pval.m_backend._72_8_);
  }
  *(int *)(*(long *)(in_RDI + 0x310) + (long)local_d0 * 4) =
       *(int *)(*(long *)(in_RDI + 0x310) + (long)local_d0 * 4) -
       *(int *)(*(long *)(in_RDI + 0x368) + (long)local_d0 * 4);
  local_bc = *(int *)(*(long *)(in_RDI + 0x2a8) + (long)local_ac * 4);
  local_12c = local_bc + local_128;
  for (; local_bc < local_12c; local_bc = local_bc + 1) {
    local_c0 = *(int *)(*(long *)(in_RDI + 0x2a0) + (long)local_bc * 4);
    local_2c0 = 0;
    local_90 = *(long *)(in_RDI + 800) + (long)local_c0 * 0x50;
    local_98 = &local_2c0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_stack_fffffffffffffcf0,(long_long_type)in_stack_fffffffffffffce8);
    *(undefined4 *)(*(long *)(in_RDI + 0x348) + (long)local_c0 * 4) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0x398) + (long)local_c0 * 0x20) =
         *(undefined8 *)
          (*(long *)(in_RDI + 0x3a0) +
          (long)*(int *)(*(long *)(in_RDI + 0x368) + (long)local_c0 * 4) * 0x20);
    *(long *)(*(long *)(*(long *)(in_RDI + 0x398) + (long)local_c0 * 0x20) + 8) =
         *(long *)(in_RDI + 0x398) + (long)local_c0 * 0x20;
    *(long *)(*(long *)(in_RDI + 0x398) + (long)local_c0 * 0x20 + 8) =
         *(long *)(in_RDI + 0x3a0) +
         (long)*(int *)(*(long *)(in_RDI + 0x368) + (long)local_c0 * 4) * 0x20;
    *(long *)(*(long *)(in_RDI + 0x3a0) +
             (long)*(int *)(*(long *)(in_RDI + 0x368) + (long)local_c0 * 4) * 0x20) =
         *(long *)(in_RDI + 0x398) + (long)local_c0 * 0x20;
  }
  return;
}

Assistant:

void CLUFactor<R>::eliminatePivot(int prow, int pos, R eps)
{
   int i, j, k, m = -1;
   int lv = -1;  // This value should never be used.
   int pcol;
   R pval;
   int pbeg = u.row.start[prow];
   int plen = --(u.row.len[prow]);
   int pend = pbeg + plen;


   /*  extract pivot element   */
   i = pbeg + pos;
   pcol = u.row.idx[i];
   pval = u.row.val[i];
   removeDR(temp.pivot_col[pcol]);
   initDR(temp.pivot_col[pcol]);

   /*  remove pivot from pivot row     */
   u.row.idx[i] = u.row.idx[pend];
   u.row.val[i] = u.row.val[pend];

   /*  set pivot element and construct L VectorBase<R> */
   setPivot(temp.stage++, pcol, prow, pval);

   /**@todo If this test failes, lv has no value. I suppose that in this
    *       case none of the loops below that uses lv is executed.
    *       But this is unproven.
    */

   if(temp.s_cact[pcol] - 1 > 0)
      lv = makeLvec(temp.s_cact[pcol] - 1, prow);

   /*  init working VectorBase<R>,
    *  remove pivot row from working matrix
    *  and remove columns from list.
    */
   for(i = pbeg; i < pend; ++i)
   {
      j = u.row.idx[i];
      temp.s_mark[j] = 1;
      work[j] = u.row.val[i];
      removeDR(temp.pivot_col[j]);
      m = u.col.start[j] + u.col.len[j] - temp.s_cact[j];

      for(k = m; u.col.idx[k] != prow; ++k)
         ;

      u.col.idx[k] = u.col.idx[m];

      u.col.idx[m] = prow;

      temp.s_cact[j]--;
   }

   /*  perform L and update loop
    */
   for(i = u.col.len[pcol] - temp.s_cact[pcol];
         (m = u.col.idx[u.col.start[pcol] + i]) != prow;
         ++i)
   {
      assert(row.perm[m] < 0);
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(m, lv++, prow, pcol, pval, eps);
   }

   /*  skip pivot row  */

   m = u.col.len[pcol];

   for(++i; i < m; ++i)
   {
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(u.col.idx[u.col.start[pcol] + i], lv++, prow, pcol, pval, eps);
   }

   /*  remove pivot column from column file.
    */
   u.col.len[pcol] -= temp.s_cact[pcol];

   /*  clear working VectorBase<R> and reinsert columns to lists
    */
   for(i = u.row.start[prow], pend = i + plen; i < pend; ++i)
   {
      j = u.row.idx[i];
      work[j] = 0;
      temp.s_mark[j] = 0;
      init2DR(temp.pivot_col[j], temp.pivot_colNZ[temp.s_cact[j]]);
      assert(col.perm[j] < 0);
   }
}